

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaTest.cpp
# Opt level: O0

void __thiscall Arena_BigAndOverflow_Test::TestBody(Arena_BigAndOverflow_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  pair<long_*,_long_*> pVar3;
  pair<long_*,_long_*> pVar4;
  string local_2d8;
  AssertHelper local_2b8;
  Message local_2b0;
  bool local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_;
  Message local_288 [2];
  bad_alloc *anon_var_0_4;
  type e_4;
  long *local_248;
  byte local_239;
  undefined1 auStack_238 [7];
  bool gtest_caught_expected_4;
  TrueWithString gtest_msg_4;
  size_t greaterOverflow;
  Message local_208 [2];
  bad_alloc *anon_var_0_3;
  type e_3;
  long *local_1c8;
  byte local_1b9;
  undefined1 auStack_1b8 [7];
  bool gtest_caught_expected_3;
  TrueWithString gtest_msg_3;
  size_t smallerOverflow;
  Message local_188 [2];
  bad_alloc *anon_var_0_2;
  type e_2;
  undefined1 auStack_148 [7];
  bool gtest_caught_expected_2;
  TrueWithString gtest_msg_2;
  AssertHelper local_120;
  Message local_118 [2];
  bad_alloc *anon_var_0_1;
  type e_1;
  undefined1 auStack_d8 [7];
  bool gtest_caught_expected_1;
  TrueWithString gtest_msg_1;
  AssertHelper local_b0;
  Message local_a8 [2];
  bad_alloc *anon_var_0;
  type e;
  byte local_65;
  bool gtest_caught_expected;
  undefined1 auStack_58 [8];
  TrueWithString gtest_msg;
  undefined1 local_30 [8];
  Arena arena;
  Arena_BigAndOverflow_Test *this_local;
  
  arena._blocks._block._previous = (Block *)this;
  memt::Arena::Arena((Arena *)local_30);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_58 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_58);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_58);
  if (bVar1) {
    local_65 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      memt::Arena::alloc((Arena *)local_30,0xffffffffffffffff);
    }
    if ((local_65 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_58,
                 "Expected: arena.alloc(static_cast<size_t>(-1)) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
                );
      goto LAB_001113dd;
    }
    e._4_4_ = 0;
  }
  else {
LAB_001113dd:
    testing::Message::Message(local_a8);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x5a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(local_a8);
    e._4_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_58);
  if (e._4_4_ != 0) goto LAB_001123cd;
  gtest_msg_1.value._M_string_length = 0;
  gtest_msg_1.value.field_2._M_allocated_capacity = 0;
  auStack_d8[0] = (_Alloc_hider)0x0;
  stack0xffffffffffffff29 = 0;
  gtest_msg_1.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_1.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_d8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_d8);
  if (bVar1) {
    e_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      memt::Arena::alloc((Arena *)local_30,0x8000000000000000);
    }
    if ((e_1._7_1_ & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_d8,
                 "Expected: arena.alloc(static_cast<size_t>(-1)/2 + 1) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
                );
      goto LAB_00111719;
    }
    e._4_4_ = 0;
  }
  else {
LAB_00111719:
    testing::Message::Message(local_118);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x5d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::Message::~Message(local_118);
    e._4_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_d8);
  if (e._4_4_ != 0) goto LAB_001123cd;
  gtest_msg_2.value._M_string_length = 0;
  gtest_msg_2.value.field_2._M_allocated_capacity = 0;
  auStack_148[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffeb9 = 0;
  gtest_msg_2.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_2.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_148);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_148);
  if (bVar1) {
    e_2._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      memt::Arena::alloc((Arena *)local_30,0x7fffffffffffff9b);
    }
    if ((e_2._7_1_ & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_148,
                 "Expected: arena.alloc(static_cast<size_t>(-1)/2 - 100) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
                );
      goto LAB_00111a5e;
    }
    e._4_4_ = 0;
  }
  else {
LAB_00111a5e:
    testing::Message::Message(local_188);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&smallerOverflow,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x61,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&smallerOverflow,local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&smallerOverflow);
    testing::Message::~Message(local_188);
    e._4_4_ = 1;
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_148);
  if (e._4_4_ != 0) goto LAB_001123cd;
  gtest_msg_3.value.field_2._8_8_ = 0x8000000000000000;
  gtest_msg_3.value._M_string_length = 0;
  gtest_msg_3.value.field_2._M_allocated_capacity = 0;
  auStack_1b8[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffe49 = 0;
  gtest_msg_3.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_3.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_1b8);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_1b8);
  if (bVar1) {
    local_1b9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    pVar3.second = local_1c8;
    pVar3.first = (long *)e_3;
    if (bVar1) {
      pVar3 = memt::Arena::allocArray<long>((Arena *)local_30,0x8000000000000000);
    }
    local_1c8 = pVar3.second;
    e_3 = (type)pVar3.first;
    if ((local_1b9 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_1b8,
                 "Expected: arena.allocArray<long>(smallerOverflow) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
                );
      goto LAB_00111dde;
    }
    e._4_4_ = 0;
  }
  else {
LAB_00111dde:
    testing::Message::Message(local_208);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&greaterOverflow,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&greaterOverflow,local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&greaterOverflow);
    testing::Message::~Message(local_208);
    pVar3.second = local_1c8;
    pVar3.first = (long *)e_3;
    e._4_4_ = 1;
  }
  local_1c8 = pVar3.second;
  e_3 = (type)pVar3.first;
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_1b8);
  if (e._4_4_ != 0) goto LAB_001123cd;
  gtest_msg_4.value.field_2._8_8_ = 0x7fffffffffffffff;
  gtest_msg_4.value._M_string_length = 0;
  gtest_msg_4.value.field_2._M_allocated_capacity = 0;
  auStack_238[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffdc9 = 0;
  gtest_msg_4.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg_4.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_238);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_238);
  if (bVar1) {
    local_239 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    pVar4.second = local_248;
    pVar4.first = (long *)e_4;
    if (bVar1) {
      pVar4 = memt::Arena::allocArray<long>((Arena *)local_30,0x7fffffffffffffff);
    }
    local_248 = pVar4.second;
    e_4 = (type)pVar4.first;
    if ((local_239 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)auStack_238,
                 "Expected: arena.allocArray<long>(greaterOverflow) throws an exception of type std::bad_alloc.\n  Actual: it throws nothing."
                );
      goto LAB_0011215e;
    }
    e._4_4_ = 0;
  }
  else {
LAB_0011215e:
    testing::Message::Message(local_288);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
               ,0x6e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(local_288);
    pVar4.second = local_248;
    pVar4.first = (long *)e_4;
    e._4_4_ = 1;
  }
  local_248 = pVar4.second;
  e_4 = (type)pVar4.first;
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_238);
  if (e._4_4_ == 0) {
    local_2a1 = memt::Arena::isEmpty((Arena *)local_30);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_2a0,&local_2a1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2d8,(internal *)local_2a0,(AssertionResult *)"arena.isEmpty()","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Macaulay2[P]memtailor/src/test/ArenaTest.cpp"
                 ,0x70,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
      testing::internal::AssertHelper::~AssertHelper(&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      testing::Message::~Message(&local_2b0);
    }
    e._4_4_ = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    if (e._4_4_ == 0) {
      e._4_4_ = 0;
    }
  }
LAB_001123cd:
  memt::Arena::~Arena((Arena *)local_30);
  return;
}

Assistant:

TEST(Arena, BigAndOverflow) {
  memt::Arena arena;
  // aligning size causes overflow
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)), std::bad_alloc);

  // 2x size is an overflow
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)/2 + 1), std::bad_alloc);

  // causes attempt at allocating almost the entire virtual memory space
  // which cannot succeed
  ASSERT_THROW(arena.alloc(static_cast<size_t>(-1)/2 - 100), std::bad_alloc);

  // sizeof(long) * x overflows to a smaller value (0).
  const size_t smallerOverflow = 1ul << (8*sizeof(long) - 1);
  MEMT_ASSERT(smallerOverflow > 0);
  //ASSERT(smallerOverflow * sizeof(long) == 0); compiler warning
  ASSERT_THROW(arena.allocArray<long>(smallerOverflow), std::bad_alloc);

  // sizeof(int) * x overflows to a greater value
  const size_t greaterOverflow = (~(0ul)) >> 1;
  MEMT_ASSERT(sizeof(long) >= 4);
  //ASSERT(greaterOverflow * sizeof(long) > greaterOverflow); compiler warning
  //ASSERT(greaterOverflow != (greaterOverflow * sizeof(long)) / sizeof(long));
  ASSERT_THROW(arena.allocArray<long>(greaterOverflow), std::bad_alloc);

  ASSERT_TRUE(arena.isEmpty());
}